

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName)

{
  Argument *pAVar1;
  allocator<char> local_49;
  string local_48;
  string *local_18;
  string *aProgramName_local;
  ArgumentParser *this_local;
  
  local_18 = aProgramName;
  aProgramName_local = &this->mProgramName;
  std::__cxx11::string::string((string *)this,(string *)aProgramName);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            (&this->mPositionalArguments);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            (&this->mOptionalArguments);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::map(&this->mArgumentMap);
  pAVar1 = add_argument<char_const*,char_const*>(this,"-h","--help");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show this help message and exit",&local_49);
  pAVar1 = Argument::help(pAVar1,&local_48);
  Argument::nargs(pAVar1,0);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {})
      : mProgramName(std::move(aProgramName)) {
    add_argument("-h", "--help")
        .help("show this help message and exit")
        .nargs(0);
  }